

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double empirical_discrete_cdf(double x,int a,double *b,double *c)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = r8vec_sum(a,b);
  if (a < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar1 = 0;
    do {
      if (x < c[uVar1]) {
        return dVar3;
      }
      dVar3 = dVar3 + b[uVar1] / dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)a != uVar1);
  }
  return dVar3;
}

Assistant:

double empirical_discrete_cdf ( double x, int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_CDF evaluates the Empirical Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B[A], the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C[A], the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_CDF, the value of the CDF.
//
{
  double bsum;
  double cdf;
  int i;

  cdf = 0.0;

  bsum = r8vec_sum ( a, b );

  for ( i = 1; i <= a; i++ )
  {
    if ( x < c[i-1] )
    {
      return cdf;
    }
    cdf = cdf + b[i-1] / bsum;
  }

  return cdf;
}